

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbcGlucose.cpp
# Opt level: O1

void Glucose_CheckTwoNodesTest(Gia_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  int iVar4;
  SimpSolver *pSat;
  char *pcVar5;
  int fEquiv;
  int iVar6;
  char *pcVar7;
  
  pSat = glucose_solver_start();
  fEquiv = 0;
  while( true ) {
    iVar6 = p->vCos->nSize;
    if (iVar6 <= p->nRegs) break;
    if (iVar6 < 1) {
LAB_005b4fdd:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                    ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
    }
    piVar3 = p->vCos->pArray;
    iVar4 = *piVar3;
    if (((long)iVar4 < 0) || (p->nObjs <= iVar4)) {
LAB_005b4f9f:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    uVar1 = *(uint *)(p->pObjs + iVar4);
    iVar4 = iVar4 - (uVar1 & 0x1fffffff);
    if (iVar4 < 0) {
LAB_005b4ffc:
      __assert_fail("Var >= 0 && !(c >> 1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                    ,0x12e,"int Abc_Var2Lit(int, int)");
    }
    if (iVar6 - p->nRegs == 1) break;
    if (iVar6 == 1) goto LAB_005b4fdd;
    iVar6 = piVar3[1];
    if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_005b4f9f;
    uVar2 = *(uint *)(p->pObjs + iVar6);
    iVar6 = iVar6 - (uVar2 & 0x1fffffff);
    if (iVar6 < 0) goto LAB_005b4ffc;
    iVar6 = bmcg_sat_solver_equiv_overlap_check
                      (pSat,p,(uVar1 >> 0x1d & 1) + iVar4 * 2,(uVar2 >> 0x1d & 1) + iVar6 * 2,fEquiv
                      );
    (*(pSat->super_Solver)._vptr_Solver[2])(pSat);
    pcVar7 = "Equivalence";
    if (fEquiv == 0) {
      pcVar7 = "Overlap";
    }
    pcVar5 = "holds";
    if (iVar6 == 0) {
      pcVar5 = "fails";
    }
    printf("%s %s.\n",pcVar7,pcVar5);
    fEquiv = fEquiv + 1;
    if (fEquiv != 1) {
      (*(pSat->super_Solver)._vptr_Solver[1])(pSat);
      return;
    }
  }
  __assert_fail("v < Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
}

Assistant:

void Glucose_CheckTwoNodesTest( Gia_Man_t * p )
{
    int n, Res;
    bmcg_sat_solver * pSat = bmcg_sat_solver_start();
    for ( n = 0; n < 2; n++ )
    {
        Res = bmcg_sat_solver_equiv_overlap_check( 
            pSat, p, 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 0)), 
            Gia_ObjFaninLit0p(p, Gia_ManPo(p, 1)), 
            n );
        bmcg_sat_solver_reset( pSat );
        printf( "%s %s.\n", n ? "Equivalence" : "Overlap", Res ? "holds" : "fails" );
    }
    bmcg_sat_solver_stop( pSat );
}